

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::checkValidTagNumber(DataDictionary *this,FieldBase *field)

{
  bool bVar1;
  int field_00;
  InvalidTagNumber *this_00;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  int local_24;
  _Self local_20;
  FieldBase *local_18;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  local_18 = field;
  field_local = (FieldBase *)this;
  local_24 = FieldBase::getTag(field);
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->m_fields,&local_24);
  local_30._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_fields);
  bVar1 = std::operator==(&local_20,&local_30);
  if (!bVar1) {
    return;
  }
  this_00 = (InvalidTagNumber *)__cxa_allocate_exception(0x58);
  field_00 = FieldBase::getTag(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  InvalidTagNumber::InvalidTagNumber(this_00,field_00,&local_50);
  __cxa_throw(this_00,&InvalidTagNumber::typeinfo,InvalidTagNumber::~InvalidTagNumber);
}

Assistant:

EXCEPT(InvalidTagNumber) {
    if (m_fields.find(field.getTag()) == m_fields.end()) {
      throw InvalidTagNumber(field.getTag());
    }
  }